

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerQueue.h
# Opt level: O0

void __thiscall
WorkerQueue<QueryDatabaseSearcherWorker<Protein>,_std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_WorkerQueue<SearchResultsWriterWorker<Protein>,_std::deque<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>,_std::allocator<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<Protein>_*,_const_SearchParams<Protein>_&>
::WorkerLoop(WorkerQueue<QueryDatabaseSearcherWorker<Protein>,_std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_WorkerQueue<SearchResultsWriterWorker<Protein>,_std::deque<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>,_std::allocator<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<Protein>_*,_const_SearchParams<Protein>_&>
             *this,WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                   **args,Database<Protein> **args_1,SearchParams<Protein> *args_2)

{
  bool bVar1;
  reference __x;
  size_t sVar2;
  reference this_00;
  bool local_1e1;
  function<void_(unsigned_long,_unsigned_long)> *cb;
  iterator __end3;
  iterator __begin3;
  deque<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
  *__range3;
  unique_lock<std::mutex> lock_1;
  undefined1 local_170 [8];
  unique_lock<std::mutex> lock;
  undefined1 local_150 [8];
  QueryDatabaseSearcherWorker<Protein> worker;
  deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_> queueItem;
  SearchParams<Protein> *args_local_2;
  Database<Protein> **args_local_1;
  WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  **args_local;
  WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *this_local;
  
  std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>::deque
            ((deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_> *)&worker.mWriter);
  QueryDatabaseSearcherWorker<Protein>::QueryDatabaseSearcherWorker
            ((QueryDatabaseSearcherWorker<Protein> *)local_150,*args,*args_1,args_2);
  while( true ) {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_170,(mutex_type *)(this + 0x80));
    while( true ) {
      bVar1 = std::atomic::operator_cast_to_bool((atomic *)(this + 0xa8));
      local_1e1 = false;
      if (!bVar1) {
        local_1e1 = std::
                    queue<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_std::deque<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_std::allocator<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>_>_>_>
                    ::empty((queue<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_std::deque<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_std::allocator<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>_>_>_>
                             *)(this + 0xb0));
      }
      if (local_1e1 == false) break;
      std::condition_variable::wait((unique_lock *)(this + 0x50));
    }
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)(this + 0xa8));
    if (bVar1) {
      lock_1._12_4_ = 3;
    }
    else {
      __x = std::
            queue<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_std::deque<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_std::allocator<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>_>_>_>
            ::front((queue<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_std::deque<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_std::allocator<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>_>_>_>
                     *)(this + 0xb0));
      std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>::operator=
                ((deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_> *)&worker.mWriter,
                 __x);
      std::
      queue<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_std::deque<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_std::allocator<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>_>_>_>
      ::pop((queue<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_std::deque<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_std::allocator<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>_>_>_>
             *)(this + 0xb0));
      std::__atomic_base<int>::operator++((__atomic_base<int> *)(this + 0xac),0);
      lock_1._12_4_ = 0;
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_170);
    if (lock_1._12_4_ != 0) break;
    QueryDatabaseSearcherWorker<Protein>::Process
              ((QueryDatabaseSearcherWorker<Protein> *)local_150,
               (SequenceList<Protein> *)&worker.mWriter);
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)&__range3,(mutex_type *)(this + 0x80));
    sVar2 = QueueItemInfo<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>_>::
            Count((SequenceList<Protein> *)&worker.mWriter);
    *(size_t *)(this + 0x108) = sVar2 + *(long *)(this + 0x108);
    std::__atomic_base<int>::operator--((__atomic_base<int> *)(this + 0xac),0);
    std::
    deque<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
    ::begin((iterator *)&__end3._M_node,
            (deque<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
             *)(this + 0x110));
    std::
    deque<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
    ::end((iterator *)&cb,
          (deque<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
           *)(this + 0x110));
    while( true ) {
      bVar1 = std::operator!=((_Self *)&__end3._M_node,(_Self *)&cb);
      if (!bVar1) break;
      this_00 = std::
                _Deque_iterator<std::function<void_(unsigned_long,_unsigned_long)>,_std::function<void_(unsigned_long,_unsigned_long)>_&,_std::function<void_(unsigned_long,_unsigned_long)>_*>
                ::operator*((_Deque_iterator<std::function<void_(unsigned_long,_unsigned_long)>,_std::function<void_(unsigned_long,_unsigned_long)>_&,_std::function<void_(unsigned_long,_unsigned_long)>_*>
                             *)&__end3._M_node);
      std::function<void_(unsigned_long,_unsigned_long)>::operator()
                (this_00,*(unsigned_long *)(this + 0x108),*(unsigned_long *)(this + 0x100));
      std::
      _Deque_iterator<std::function<void_(unsigned_long,_unsigned_long)>,_std::function<void_(unsigned_long,_unsigned_long)>_&,_std::function<void_(unsigned_long,_unsigned_long)>_*>
      ::operator++((_Deque_iterator<std::function<void_(unsigned_long,_unsigned_long)>,_std::function<void_(unsigned_long,_unsigned_long)>_&,_std::function<void_(unsigned_long,_unsigned_long)>_*>
                    *)&__end3._M_node);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&__range3);
  }
  QueryDatabaseSearcherWorker<Protein>::~QueryDatabaseSearcherWorker
            ((QueryDatabaseSearcherWorker<Protein> *)local_150);
  std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>::~deque
            ((deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_> *)&worker.mWriter);
  return;
}

Assistant:

void WorkerLoop( Args&&... args ) {
    QueueItem queueItem;
    Worker    worker( std::forward< Args >( args )... );

    while( true ) {
      { // acquire lock
        std::unique_lock< std::mutex > lock( mQueueMutex );

        while( !mStop && mQueue.empty() )
          mCondition.wait( lock );

        if( mStop )
          break;

        queueItem = std::move( mQueue.front() );
        mQueue.pop();

        mWorkingCount++;
      } // release lock

      worker.Process( queueItem );

      { // acquire lock
        std::unique_lock< std::mutex > lock( mQueueMutex );
        mTotalProcessed += QueueItemInfo< QueueItem >::Count( queueItem );
        mWorkingCount--;

        for( auto& cb : mProcessedCallbacks ) {
          cb( mTotalProcessed, mTotalEnqueued );
        }
      } // release lock
    }
  }